

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O0

void __thiscall Node::OutputPrint(Node *this,ostream *os)

{
  int iVar1;
  ostream *this_00;
  int ReturnFlag;
  ostream *os_local;
  Node *this_local;
  
  IOChPrinted = 0;
  IOChannel = (Node *)0x0;
  IOUsing = (Node *)0x0;
  if (this->Tree[0] == (Node *)0x0) {
    OutputIPChannel(this,os,0);
    std::operator<<(os," << std::endl");
  }
  else {
    iVar1 = OutputPrintData(this->Tree[0],os,0);
    if (IOUsing != (Node *)0x0) {
      OutputIPChannel(this,os,0);
      std::operator<<(os," << PUse.Finish()");
    }
    if (iVar1 != 0) {
      if ((IOChannel == (Node *)0x0) || (IOChPrinted != 0)) {
        OutputIPChannel(this,os,0);
        std::operator<<(os," << std::endl");
      }
      else {
        OutputIPChannel(this,os,0);
        std::operator<<(os," << std::endl");
      }
    }
  }
  if (IOChPrinted != 0) {
    this_00 = std::operator<<(os,";");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Node::OutputPrint(
	std::ostream& os	/**< iostream to write C++ code to */
)
{
	int ReturnFlag = 0;

	//
	// Indent as necessary
	//
	IOChPrinted = 0;	// IO Channel not yet output
	IOChannel = 0;		// No IO Channel defined yet
	IOUsing = 0;		// No Print Using Statement yet

	//
	// Output print using
	//
	if (Tree[0] != 0)
	{
		//
		// Handle print statement
		//
		ReturnFlag = Tree[0]->OutputPrintData(os, 0);

		//
		// Finish off print using statement
		//
		if (IOUsing != 0)
		{
			OutputIPChannel(os, 0);
			os << " << PUse.Finish()";
		}

		//
		// Force a return at end of line?
		//
		if (ReturnFlag != 0)
		{
			if ((IOChannel == 0) || (IOChPrinted != 0))
			{
				OutputIPChannel(os, 0);
				os << " << std::endl";
			}
			else
			{
				//
				// When using a BChannel, it doesn't handle this
				// case properly in C++, so fake it.
				//
				OutputIPChannel(os, 0);
				os << " << std::endl";
			}
		}
	}
	else
	{
		//
		// Empty print command
		//
		if ((IOChannel == 0) || (IOChPrinted != 0))
		{
			OutputIPChannel(os, 0);
			os << " << std::endl";
		}
		else
		{
			//
			// When using a BChannel, it doesn't handle this
			// case properly in C++, so fake it.
			//
			OutputIPChannel(os, 0);
			os << " << std::endl";
		}
	}

	//
	// Close off statement
	//
	if (IOChPrinted != 0)
	{
		os << ";" << std::endl;
	}
}